

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int CTcParser::read_len_prefix_str(CVmFile *fp,char *buf,size_t buf_len,int err_if_too_long)

{
  ulong buflen;
  char b [2];
  ushort local_2a;
  
  CVmFile::read_bytes(fp,(char *)&local_2a,2);
  buflen = (ulong)local_2a;
  if (buf_len <= buflen) {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,err_if_too_long);
  }
  else {
    CVmFile::read_bytes(fp,buf,buflen);
    buf[buflen] = '\0';
  }
  return (uint)(buf_len <= buflen);
}

Assistant:

int CTcParser::read_len_prefix_str(CVmFile *fp, char *buf, size_t buf_len,
                                   int err_if_too_long)
{
    size_t read_len;
    size_t alloc_len;

    /* read the length to read from the file */
    read_len = (size_t)fp->read_uint2();

    /* add a byte for null termination */
    alloc_len = read_len + 1;

    /* if it won't fit in the temporary buffer, it's an error */
    if (alloc_len > buf_len)
    {
        /* log the error and return failure */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, err_if_too_long);
        return 1;
    }

    /* read the bytes into the caller's buffer */
    fp->read_bytes(buf, read_len);

    /* add null termination */
    buf[read_len] = '\0';

    /* success */
    return 0;
}